

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O0

int Am_Fill_To_Right_proc(Am_Object *self)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Am_Value *pAVar5;
  Am_Object local_20;
  Am_Object owner;
  Am_Object *self_local;
  
  owner.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    pAVar5 = Am_Object::Get(&local_20,0x66,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = Am_Object::Get((Am_Object *)owner.data,100,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = Am_Object::Get(&local_20,0xa0,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar5);
    self_local._4_4_ = (iVar2 - iVar3) - iVar4;
  }
  else {
    self_local._4_4_ = 0;
  }
  Am_Object::~Am_Object(&local_20);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, Am_Fill_To_Right)
{
  Am_Object owner = self.Get_Owner();
  if (!owner.Valid())
    return 0;
  return (int)(owner.Get(Am_WIDTH)) - (int)(self.Get(Am_LEFT)) -
         (int)(owner.Get(Am_RIGHT_OFFSET));
}